

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O1

void __thiscall
LPCMStreamReader::restoreChannelData
          (LPCMStreamReader *this,uint8_t *start,uint8_t *end,int chNum,uint8_t *tmpData,int mch)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  uVar1 = 3;
  if (this->m_bitsPerSample != 0x14) {
    uVar1 = (uint)(this->m_bitsPerSample >> 3);
  }
  puVar2 = start + (int)((chNum + -1) * uVar1);
  if (puVar2 < end) {
    do {
      if (uVar1 != 0) {
        uVar3 = 0;
        do {
          puVar2[uVar3] = tmpData[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        tmpData = tmpData + uVar3;
      }
      puVar2 = puVar2 + (int)(mch * uVar1);
    } while (puVar2 < end);
  }
  return;
}

Assistant:

void LPCMStreamReader::restoreChannelData(uint8_t* start, const uint8_t* end, const int chNum, const uint8_t* tmpData,
                                          const int mch) const
{
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = mch * ch1SampleSize;
    const int offset = ch1SampleSize * (chNum - 1);
    uint8_t* curPos = start + offset;
    const uint8_t* src = tmpData;
    for (; curPos < end; curPos += fullSampleSize)
    {
        for (int j = 0; j < ch1SampleSize; j++) curPos[j] = *src++;
    }
}